

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.c
# Opt level: O3

int main(void)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  char *src;
  char *out;
  ssize_t sVar5;
  long lVar6;
  char *__s;
  ulong uVar7;
  int iVar8;
  long lVar9;
  float fVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  buffers b;
  base64_timespec end;
  base64_timespec start;
  size_t local_88;
  size_t local_80;
  long local_78;
  char *local_70;
  timespec local_68;
  timespec local_58;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_88 = 0xa00000;
  local_80 = 0x10aaaaa;
  src = (char *)malloc(0xa00000);
  __s = "Out of memory";
  iVar4 = 1;
  if (src != (char *)0x0) {
    out = (char *)malloc(0x10aaaaa);
    if (out == (char *)0x0) {
      free(src);
    }
    else {
      bVar1 = false;
      iVar3 = open("/dev/urandom",0);
      iVar4 = 1;
      if (iVar3 < 0) {
        __s = "Cannot open /dev/urandom";
      }
      else {
        printf("Filling buffer with %.1f MB of random data...\n",0x4024000000000000);
        uVar7 = 0;
        do {
          sVar5 = read(iVar3,src + uVar7,0xa00000 - uVar7);
          if (sVar5 < 0) {
            close(iVar3);
            __s = "Read error";
            bVar1 = false;
            iVar4 = 1;
            goto LAB_001025ed;
          }
          uVar7 = uVar7 + sVar5;
        } while (uVar7 < 0xa00000);
        close(iVar3);
        lVar6 = 0;
        do {
          local_38 = lVar6;
          printf("Testing with buffer size %s, fastest of %d * %d\n",sizes[lVar6].label,
                 (ulong)(uint)sizes[lVar6].repeat,(ulong)(uint)sizes[lVar6].batch);
          if (*codecs != (char *)0x0) {
            lVar9 = 0;
            do {
              iVar3 = 1 << ((byte)lVar9 & 0x1f);
              iVar4 = codec_supported(iVar3);
              if (iVar4 != 0) {
                local_70 = codecs[lVar9];
                local_88 = sizes[lVar6].len;
                iVar4 = sizes[lVar6].repeat;
                fVar10 = -1.0;
                local_78 = lVar9;
                if (iVar4 != 0) {
                  fVar10 = -1.0;
                  uVar11 = 0;
                  uVar12 = 0;
                  uVar13 = 0;
                  do {
                    local_48 = fVar10;
                    uStack_44 = uVar11;
                    uStack_40 = uVar12;
                    uStack_3c = uVar13;
                    clock_gettime(0,&local_58);
                    for (iVar8 = sizes[lVar6].batch; iVar8 != 0; iVar8 = iVar8 + -1) {
                      base64_encode(src,local_88,out,&local_80,iVar3);
                    }
                    clock_gettime(0,&local_68);
                    fVar10 = ((float)(local_68.tv_nsec - local_58.tv_nsec) / 1e+09 +
                             (float)(local_68.tv_sec - local_58.tv_sec)) / (float)sizes[lVar6].batch
                    ;
                    uVar11 = 0;
                    uVar12 = 0;
                    uVar13 = 0;
                    if (local_48 <= fVar10 && 0.0 <= local_48) {
                      fVar10 = local_48;
                      uVar11 = uStack_44;
                      uVar12 = uStack_40;
                      uVar13 = uStack_3c;
                    }
                    iVar4 = iVar4 + -1;
                  } while (iVar4 != 0);
                }
                lVar9 = local_78;
                printf("%s\tencode\t%.02f MB/sec\n",
                       (double)(((float)local_88 * 9.536743e-07) / fVar10),local_70);
                local_80 = sizes[lVar6].len;
                iVar4 = sizes[lVar6].repeat;
                fVar10 = -1.0;
                if (iVar4 != 0) {
                  fVar10 = -1.0;
                  uVar11 = 0;
                  uVar12 = 0;
                  uVar13 = 0;
                  do {
                    local_48 = fVar10;
                    uStack_44 = uVar11;
                    uStack_40 = uVar12;
                    uStack_3c = uVar13;
                    clock_gettime(0,&local_58);
                    for (iVar8 = sizes[lVar6].batch; iVar8 != 0; iVar8 = iVar8 + -1) {
                      base64_decode(out,local_80,src,&local_88,iVar3);
                    }
                    clock_gettime(0,&local_68);
                    fVar10 = ((float)(local_68.tv_nsec - local_58.tv_nsec) / 1e+09 +
                             (float)(local_68.tv_sec - local_58.tv_sec)) / (float)sizes[lVar6].batch
                    ;
                    uVar11 = 0;
                    uVar12 = 0;
                    uVar13 = 0;
                    if (local_48 <= fVar10 && 0.0 <= local_48) {
                      fVar10 = local_48;
                      uVar11 = uStack_44;
                      uVar12 = uStack_40;
                      uVar13 = uStack_3c;
                    }
                    iVar4 = iVar4 + -1;
                    lVar9 = local_78;
                  } while (iVar4 != 0);
                }
                printf("%s\tdecode\t%.02f MB/sec\n",
                       (double)(((float)local_80 * 9.536743e-07) / fVar10),local_70);
              }
              lVar2 = lVar9 + 1;
              lVar9 = lVar9 + 1;
            } while (codecs[lVar2] != (char *)0x0);
          }
          lVar6 = local_38 + 1;
        } while (lVar6 != 5);
        __s = (char *)0x0;
        bVar1 = true;
        iVar4 = 0;
      }
LAB_001025ed:
      free(out);
      free(src);
      if (bVar1) {
        return iVar4;
      }
    }
  }
  fputs(__s,_stderr);
  return iVar4;
}

Assistant:

int
main ()
{
	int ret = 0;
	char *errmsg = NULL;
	struct buffers b;

	// Set buffer sizes to largest buffer length:
	b.regsz = sizes[0].len;
	b.encsz = sizes[0].len * 5 / 3;

	// Allocate space for megabytes of random data:
	if ((b.reg = malloc(b.regsz)) == NULL) {
		errmsg = "Out of memory";
		ret = 1;
		goto err0;
	}

	// Allocate space for encoded output:
	if ((b.enc = malloc(b.encsz)) == NULL) {
		errmsg = "Out of memory";
		ret = 1;
		goto err1;
	}

	// Fill buffer with random data:
	if (get_random_data(&b, &errmsg) == false) {
		ret = 1;
		goto err2;
	}

	// Loop over all buffer sizes:
	for (size_t i = 0; i < sizeof(sizes) / sizeof(sizes[0]); i++) {
		printf("Testing with buffer size %s, fastest of %d * %d\n",
			sizes[i].label, sizes[i].repeat, sizes[i].batch);

		// Loop over all codecs:
		for (size_t j = 0; codecs[j]; j++)
			if (codec_supported(1 << j))
				codec_bench(&b, &sizes[i], codecs[j], 1 << j);
	};

	// Free memory:
err2:	free(b.enc);
err1:	free(b.reg);
err0:	if (errmsg)
		fputs(errmsg, stderr);

	return ret;
}